

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,int saveSqlFlag,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  int iVar1;
  int iVar2;
  char *zSql_00;
  u8 enc;
  void *pvVar3;
  char *zTail8;
  char *local_38;
  
  enc = (u8)saveSqlFlag;
  local_38 = (char *)0x0;
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3SafetyCheckOk(db);
  if (iVar1 == 0) {
    iVar1 = 0x15;
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x1770d,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
  }
  else {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    zSql_00 = sqlite3Utf16to8(db,zSql,nBytes,enc);
    if (zSql_00 == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = sqlite3LockAndPrepare(db,zSql_00,-1,saveSqlFlag,(Vdbe *)0x0,ppStmt,&local_38);
      if (pzTail != (void **)0x0 && local_38 != (char *)0x0) {
        iVar2 = sqlite3Utf8CharLen(zSql_00,(int)local_38 - (int)zSql_00);
        pvVar3 = zSql;
        if (0 < iVar2) {
          do {
            pvVar3 = (void *)((long)pvVar3 +
                             (ulong)((*(byte *)((long)pvVar3 + 1) & 0xf8) == 0xd8) * 2 + 2);
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        *pzTail = (void *)((long)((int)pvVar3 - (int)zSql) + (long)zSql);
      }
    }
    sqlite3DbFree(db,zSql_00);
    iVar1 = sqlite3ApiExit(db,iVar1);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar1;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */ 
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  int saveSqlFlag,          /* True to save SQL text into the sqlite3_stmt */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

  assert( ppStmt );
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, saveSqlFlag, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, chars_parsed);
  }
  sqlite3DbFree(db, zSql8); 
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}